

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined4 uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined4 uVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  
  fVar16 = scale * r_scale0;
  pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar6 = pBVar5[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar5[itime].super_RawBufferView.stride;
  lVar29 = (uVar4 + 1) * sVar7;
  lVar28 = (uVar4 + 2) * sVar7;
  lVar27 = (uVar4 + 3) * sVar7;
  aVar1 = ofs->field_0;
  auVar34 = vsubps_avx(*(undefined1 (*) [16])(pcVar6 + uVar4 * sVar7),(undefined1  [16])aVar1);
  auVar66._0_4_ = scale * auVar34._0_4_;
  auVar66._4_4_ = scale * auVar34._4_4_;
  auVar66._8_4_ = scale * auVar34._8_4_;
  auVar66._12_4_ = scale * auVar34._12_4_;
  auVar37._4_4_ = auVar66._0_4_;
  auVar37._0_4_ = auVar66._0_4_;
  auVar37._8_4_ = auVar66._0_4_;
  auVar37._12_4_ = auVar66._0_4_;
  auVar34 = vshufps_avx(auVar66,auVar66,0x55);
  aVar2 = (space->vx).field_0;
  auVar66 = vshufps_avx(auVar66,auVar66,0xaa);
  aVar3 = (space->vy).field_0;
  fVar23 = (space->vz).field_0.m128[0];
  fVar24 = (space->vz).field_0.m128[1];
  fVar25 = (space->vz).field_0.m128[2];
  fVar26 = (space->vz).field_0.m128[3];
  auVar31._0_4_ = fVar23 * auVar66._0_4_;
  auVar31._4_4_ = fVar24 * auVar66._4_4_;
  auVar31._8_4_ = fVar25 * auVar66._8_4_;
  auVar31._12_4_ = fVar26 * auVar66._12_4_;
  auVar34 = vfmadd231ps_fma(auVar31,(undefined1  [16])aVar3,auVar34);
  auVar37 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar37);
  fVar65 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar17 = fVar16 * fVar65 * *(float *)(pcVar6 + uVar4 * sVar7 + 0xc);
  auVar34 = vsubps_avx(*(undefined1 (*) [16])(pcVar6 + lVar29),(undefined1  [16])aVar1);
  auVar38._0_4_ = scale * auVar34._0_4_;
  auVar38._4_4_ = scale * auVar34._4_4_;
  auVar38._8_4_ = scale * auVar34._8_4_;
  auVar38._12_4_ = scale * auVar34._12_4_;
  auVar74._4_4_ = auVar38._0_4_;
  auVar74._0_4_ = auVar38._0_4_;
  auVar74._8_4_ = auVar38._0_4_;
  auVar74._12_4_ = auVar38._0_4_;
  auVar34 = vshufps_avx(auVar38,auVar38,0x55);
  auVar66 = vshufps_avx(auVar38,auVar38,0xaa);
  auVar32._0_4_ = fVar23 * auVar66._0_4_;
  auVar32._4_4_ = fVar24 * auVar66._4_4_;
  auVar32._8_4_ = fVar25 * auVar66._8_4_;
  auVar32._12_4_ = fVar26 * auVar66._12_4_;
  auVar34 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar3,auVar34);
  auVar38 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar74);
  fVar18 = fVar16 * fVar65 * *(float *)(pcVar6 + lVar29 + 0xc);
  auVar34 = vsubps_avx(*(undefined1 (*) [16])(pcVar6 + lVar28),(undefined1  [16])aVar1);
  auVar39._0_4_ = scale * auVar34._0_4_;
  auVar39._4_4_ = scale * auVar34._4_4_;
  auVar39._8_4_ = scale * auVar34._8_4_;
  auVar39._12_4_ = scale * auVar34._12_4_;
  auVar36._4_4_ = auVar39._0_4_;
  auVar36._0_4_ = auVar39._0_4_;
  auVar36._8_4_ = auVar39._0_4_;
  auVar36._12_4_ = auVar39._0_4_;
  auVar34 = vshufps_avx(auVar39,auVar39,0x55);
  auVar66 = vshufps_avx(auVar39,auVar39,0xaa);
  auVar35._0_4_ = fVar23 * auVar66._0_4_;
  auVar35._4_4_ = fVar24 * auVar66._4_4_;
  auVar35._8_4_ = fVar25 * auVar66._8_4_;
  auVar35._12_4_ = fVar26 * auVar66._12_4_;
  auVar34 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar34);
  auVar39 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar36);
  fVar19 = fVar16 * fVar65 * *(float *)(pcVar6 + lVar28 + 0xc);
  auVar34 = vsubps_avx(*(undefined1 (*) [16])(pcVar6 + lVar27),(undefined1  [16])aVar1);
  auVar30._0_4_ = scale * auVar34._0_4_;
  auVar30._4_4_ = scale * auVar34._4_4_;
  auVar30._8_4_ = scale * auVar34._8_4_;
  auVar30._12_4_ = scale * auVar34._12_4_;
  auVar33._4_4_ = auVar30._0_4_;
  auVar33._0_4_ = auVar30._0_4_;
  auVar33._8_4_ = auVar30._0_4_;
  auVar33._12_4_ = auVar30._0_4_;
  auVar34 = vshufps_avx(auVar30,auVar30,0x55);
  auVar66 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar87._0_4_ = fVar23 * auVar66._0_4_;
  auVar87._4_4_ = fVar24 * auVar66._4_4_;
  auVar87._8_4_ = fVar25 * auVar66._8_4_;
  auVar87._12_4_ = fVar26 * auVar66._12_4_;
  auVar34 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar3,auVar34);
  auVar34 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar33);
  fVar16 = fVar16 * fVar65 * *(float *)(pcVar6 + lVar27 + 0xc);
  lVar27 = (long)(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 tessellationRate;
  uVar77 = auVar37._0_4_;
  uVar81 = auVar38._0_4_;
  if (lVar27 == 4) {
    auVar67._4_4_ = fVar19;
    auVar67._0_4_ = fVar19;
    auVar67._8_4_ = fVar19;
    auVar67._12_4_ = fVar19;
    auVar66 = vblendps_avx(auVar39,auVar67,8);
    auVar75._4_4_ = uVar77;
    auVar75._0_4_ = uVar77;
    auVar75._8_4_ = uVar77;
    auVar75._12_4_ = uVar77;
    auVar74 = vshufps_avx(auVar37,auVar37,0x55);
    auVar37 = vshufps_avx(auVar37,auVar37,0xaa);
    auVar78._4_4_ = fVar17;
    auVar78._0_4_ = fVar17;
    auVar78._8_4_ = fVar17;
    auVar78._12_4_ = fVar17;
    auVar83._4_4_ = uVar81;
    auVar83._0_4_ = uVar81;
    auVar83._8_4_ = uVar81;
    auVar83._12_4_ = uVar81;
    auVar36 = vshufps_avx(auVar38,auVar38,0x55);
    auVar38 = vshufps_avx(auVar38,auVar38,0xaa);
    auVar84._4_4_ = fVar18;
    auVar84._0_4_ = fVar18;
    auVar84._8_4_ = fVar18;
    auVar84._12_4_ = fVar18;
    auVar30 = vbroadcastss_avx512vl(auVar39);
    auVar31 = vshufps_avx512vl(auVar39,auVar39,0x55);
    auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
    auVar32 = vbroadcastss_avx512vl(auVar34);
    auVar33 = vshufps_avx512vl(auVar34,auVar34,0x55);
    auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
    auVar88._4_4_ = fVar16;
    auVar88._0_4_ = fVar16;
    auVar88._8_4_ = fVar16;
    auVar88._12_4_ = fVar16;
    auVar32 = vmulps_avx512vl(auVar32,catmullrom_basis0._3740_16_);
    auVar33 = vmulps_avx512vl(auVar33,catmullrom_basis0._3740_16_);
    auVar34 = vmulps_avx512vl(auVar34,catmullrom_basis0._3740_16_);
    auVar35 = vmulps_avx512vl(auVar88,catmullrom_basis0._3740_16_);
    auVar30 = vfmadd231ps_avx512vl(auVar32,catmullrom_basis0._2584_16_,auVar30);
    auVar31 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._2584_16_,auVar31);
    auVar34 = vfmadd231ps_fma(auVar34,catmullrom_basis0._2584_16_,auVar39);
    auVar39 = vfmadd231ps_fma(auVar35,auVar67,catmullrom_basis0._2584_16_);
    auVar30 = vfmadd231ps_avx512vl(auVar30,catmullrom_basis0._1428_16_,auVar83);
    auVar36 = vfmadd231ps_avx512vl(auVar31,catmullrom_basis0._1428_16_,auVar36);
    auVar34 = vfmadd231ps_fma(auVar34,catmullrom_basis0._1428_16_,auVar38);
    auVar38 = vfmadd231ps_fma(auVar39,catmullrom_basis0._1428_16_,auVar84);
    auVar30 = vfmadd231ps_avx512vl(auVar30,catmullrom_basis0._272_16_,auVar75);
    auVar31 = vfmadd231ps_avx512vl(auVar36,catmullrom_basis0._272_16_,auVar74);
    auVar74 = vfmadd231ps_fma(auVar34,catmullrom_basis0._272_16_,auVar37);
    auVar36 = vfmadd231ps_fma(auVar38,catmullrom_basis0._272_16_,auVar78);
    auVar32 = vshufps_avx512vl(auVar30,auVar30,0xb1);
    auVar37 = vminps_avx512vl(auVar32,auVar30);
    auVar34 = vshufpd_avx(auVar37,auVar37,1);
    auVar34 = vminps_avx(auVar34,auVar37);
    auVar33 = vshufps_avx512vl(auVar31,auVar31,0xb1);
    auVar38 = vminps_avx512vl(auVar33,auVar31);
    auVar37 = vshufpd_avx(auVar38,auVar38,1);
    auVar37 = vminps_avx(auVar37,auVar38);
    auVar34 = vinsertps_avx(auVar34,auVar37,0x1c);
    auVar39 = vshufps_avx(auVar74,auVar74,0xb1);
    auVar37 = vminps_avx(auVar39,auVar74);
    auVar38 = vshufpd_avx(auVar37,auVar37,1);
    auVar37 = vminps_avx(auVar38,auVar37);
    auVar34 = vinsertps_avx(auVar34,auVar37,0x20);
    auVar38 = vmaxps_avx512vl(auVar32,auVar30);
    auVar37 = vshufpd_avx(auVar38,auVar38,1);
    auVar37 = vmaxps_avx(auVar37,auVar38);
    auVar30 = vmaxps_avx512vl(auVar33,auVar31);
    auVar38 = vshufpd_avx(auVar30,auVar30,1);
    auVar38 = vmaxps_avx(auVar38,auVar30);
    auVar37 = vinsertps_avx(auVar37,auVar38,0x1c);
    auVar38 = vmaxps_avx(auVar39,auVar74);
    auVar39 = vshufpd_avx(auVar38,auVar38,1);
    auVar38 = vmaxps_avx(auVar39,auVar38);
    auVar37 = vinsertps_avx(auVar37,auVar38,0x20);
    auVar21._8_4_ = 0x7fffffff;
    auVar21._0_8_ = 0x7fffffff7fffffff;
    auVar21._12_4_ = 0x7fffffff;
    auVar38 = vandps_avx512vl(auVar36,auVar21);
    auVar39 = vprolq_avx512vl(auVar38,0x20);
    auVar38 = vmaxps_avx(auVar39,auVar38);
    uVar77 = auVar38._0_4_;
    auVar79._4_4_ = uVar77;
    auVar79._0_4_ = uVar77;
    auVar79._8_4_ = uVar77;
    auVar79._12_4_ = uVar77;
    auVar38 = vshufps_avx(auVar38,auVar38,0xaa);
    auVar38 = vmaxps_avx(auVar38,auVar79);
    auVar34 = vminps_avx(auVar34,auVar66);
    auVar66 = vmaxps_avx(auVar37,auVar66);
    auVar22._8_4_ = 0x7fffffff;
    auVar22._0_8_ = 0x7fffffff7fffffff;
    auVar22._12_4_ = 0x7fffffff;
    auVar37 = vandps_avx512vl(auVar67,auVar22);
    auVar37 = vmaxps_avx(auVar38,auVar37);
    auVar34 = vsubps_avx(auVar34,auVar37);
    auVar70._0_4_ = auVar66._0_4_ + auVar37._0_4_;
    auVar70._4_4_ = auVar66._4_4_ + auVar37._4_4_;
    auVar70._8_4_ = auVar66._8_4_ + auVar37._8_4_;
    auVar70._12_4_ = auVar66._12_4_ + auVar37._12_4_;
  }
  else {
    auVar40 = vpbroadcastd_avx512vl();
    auVar73._4_4_ = uVar77;
    auVar73._0_4_ = uVar77;
    auVar73._8_4_ = uVar77;
    auVar73._12_4_ = uVar77;
    auVar73._16_4_ = uVar77;
    auVar73._20_4_ = uVar77;
    auVar73._24_4_ = uVar77;
    auVar73._28_4_ = uVar77;
    auVar41 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar42 = vpermps_avx512vl(auVar41,ZEXT1632(auVar37));
    auVar43 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar44 = vpermps_avx512vl(auVar43,ZEXT1632(auVar37));
    auVar80._4_4_ = fVar17;
    auVar80._0_4_ = fVar17;
    auVar80._8_4_ = fVar17;
    auVar80._12_4_ = fVar17;
    auVar80._16_4_ = fVar17;
    auVar80._20_4_ = fVar17;
    auVar80._24_4_ = fVar17;
    auVar80._28_4_ = fVar17;
    auVar82._4_4_ = uVar81;
    auVar82._0_4_ = uVar81;
    auVar82._8_4_ = uVar81;
    auVar82._12_4_ = uVar81;
    auVar82._16_4_ = uVar81;
    auVar82._20_4_ = uVar81;
    auVar82._24_4_ = uVar81;
    auVar82._28_4_ = uVar81;
    auVar45 = vpermps_avx512vl(auVar41,ZEXT1632(auVar38));
    auVar46 = vpermps_avx512vl(auVar43,ZEXT1632(auVar38));
    auVar85._4_4_ = fVar18;
    auVar85._0_4_ = fVar18;
    auVar85._8_4_ = fVar18;
    auVar85._12_4_ = fVar18;
    auVar85._16_4_ = fVar18;
    auVar85._20_4_ = fVar18;
    auVar85._24_4_ = fVar18;
    auVar85._28_4_ = fVar18;
    uVar77 = auVar39._0_4_;
    auVar86._4_4_ = uVar77;
    auVar86._0_4_ = uVar77;
    auVar86._8_4_ = uVar77;
    auVar86._12_4_ = uVar77;
    auVar86._16_4_ = uVar77;
    auVar86._20_4_ = uVar77;
    auVar86._24_4_ = uVar77;
    auVar86._28_4_ = uVar77;
    auVar47 = vpermps_avx512vl(auVar41,ZEXT1632(auVar39));
    auVar48 = vpermps_avx512vl(auVar43,ZEXT1632(auVar39));
    auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)fVar19));
    auVar50 = vbroadcastss_avx512vl(auVar34);
    auVar51 = vpermps_avx512vl(auVar41,ZEXT1632(auVar34));
    auVar52 = vpermps_avx512vl(auVar43,ZEXT1632(auVar34));
    auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)fVar16));
    lVar28 = lVar27 * 0x44;
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar41._8_4_ = 0xff800000;
    auVar41._0_8_ = 0xff800000ff800000;
    auVar41._12_4_ = 0xff800000;
    auVar41._16_4_ = 0xff800000;
    auVar41._20_4_ = 0xff800000;
    auVar41._24_4_ = 0xff800000;
    auVar41._28_4_ = 0xff800000;
    auVar69 = ZEXT864(0);
    lVar29 = 0;
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar43 = auVar41;
    auVar64 = auVar41;
    auVar62 = auVar54;
    auVar63 = auVar54;
    for (; auVar68 = auVar69._0_32_, lVar29 <= lVar27; lVar29 = lVar29 + 8) {
      auVar56 = vpbroadcastd_avx512vl();
      auVar56 = vpord_avx512vl(auVar56,_DAT_01fb4ba0);
      uVar20 = vpcmpgtd_avx512vl(auVar56,auVar40);
      auVar56 = *(undefined1 (*) [32])(lVar28 + 0x2204c74 + lVar29 * 4);
      auVar60 = *(undefined1 (*) [32])(lVar28 + 0x22050f8 + lVar29 * 4);
      auVar57 = vmulps_avx512vl(auVar50,auVar60);
      auVar58 = vmulps_avx512vl(auVar51,auVar60);
      auVar59 = vmulps_avx512vl(auVar52,auVar60);
      auVar60 = vmulps_avx512vl(auVar53,auVar60);
      auVar57 = vfmadd231ps_avx512vl(auVar57,auVar56,auVar86);
      auVar58 = vfmadd231ps_avx512vl(auVar58,auVar56,auVar47);
      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar56,auVar48);
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar49,auVar56);
      auVar56 = *(undefined1 (*) [32])(lVar28 + 0x22047f0 + lVar29 * 4);
      auVar57 = vfmadd231ps_avx512vl(auVar57,auVar56,auVar82);
      auVar58 = vfmadd231ps_avx512vl(auVar58,auVar56,auVar45);
      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar56,auVar46);
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar85,auVar56);
      auVar56 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 * 4 + lVar28);
      auVar57 = vfmadd231ps_avx512vl(auVar57,auVar56,auVar73);
      auVar58 = vfmadd231ps_avx512vl(auVar58,auVar56,auVar42);
      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar56,auVar44);
      auVar56 = vfmadd231ps_avx512vl(auVar60,auVar80,auVar56);
      auVar60 = vminps_avx512vl(auVar62,auVar57);
      bVar8 = (byte)uVar20;
      auVar61._0_4_ = (uint)(bVar8 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar60._0_4_;
      bVar9 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar61._4_4_ = (uint)bVar9 * auVar62._4_4_ | (uint)!bVar9 * auVar60._4_4_;
      bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar61._8_4_ = (uint)bVar9 * auVar62._8_4_ | (uint)!bVar9 * auVar60._8_4_;
      bVar9 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar61._12_4_ = (uint)bVar9 * auVar62._12_4_ | (uint)!bVar9 * auVar60._12_4_;
      bVar9 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar61._16_4_ = (uint)bVar9 * auVar62._16_4_ | (uint)!bVar9 * auVar60._16_4_;
      bVar9 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar61._20_4_ = (uint)bVar9 * auVar62._20_4_ | (uint)!bVar9 * auVar60._20_4_;
      bVar9 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar61._24_4_ = (uint)bVar9 * auVar62._24_4_ | (uint)!bVar9 * auVar60._24_4_;
      bVar9 = SUB81(uVar20 >> 7,0);
      auVar61._28_4_ = (uint)bVar9 * auVar62._28_4_ | (uint)!bVar9 * auVar60._28_4_;
      auVar62 = vminps_avx512vl(auVar63,auVar58);
      auVar60._0_4_ = (uint)(bVar8 & 1) * auVar63._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar62._0_4_;
      bVar9 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar60._4_4_ = (uint)bVar9 * auVar63._4_4_ | (uint)!bVar9 * auVar62._4_4_;
      bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar60._8_4_ = (uint)bVar9 * auVar63._8_4_ | (uint)!bVar9 * auVar62._8_4_;
      bVar9 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar60._12_4_ = (uint)bVar9 * auVar63._12_4_ | (uint)!bVar9 * auVar62._12_4_;
      bVar9 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar60._16_4_ = (uint)bVar9 * auVar63._16_4_ | (uint)!bVar9 * auVar62._16_4_;
      bVar9 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar60._20_4_ = (uint)bVar9 * auVar63._20_4_ | (uint)!bVar9 * auVar62._20_4_;
      bVar9 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar60._24_4_ = (uint)bVar9 * auVar63._24_4_ | (uint)!bVar9 * auVar62._24_4_;
      bVar9 = SUB81(uVar20 >> 7,0);
      auVar60._28_4_ = (uint)bVar9 * auVar63._28_4_ | (uint)!bVar9 * auVar62._28_4_;
      auVar63 = vminps_avx512vl(auVar54,auVar59);
      auVar62._0_4_ = (uint)(bVar8 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar63._0_4_;
      bVar9 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar62._4_4_ = (uint)bVar9 * auVar54._4_4_ | (uint)!bVar9 * auVar63._4_4_;
      bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar62._8_4_ = (uint)bVar9 * auVar54._8_4_ | (uint)!bVar9 * auVar63._8_4_;
      bVar9 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar62._12_4_ = (uint)bVar9 * auVar54._12_4_ | (uint)!bVar9 * auVar63._12_4_;
      bVar9 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar62._16_4_ = (uint)bVar9 * auVar54._16_4_ | (uint)!bVar9 * auVar63._16_4_;
      bVar9 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar62._20_4_ = (uint)bVar9 * auVar54._20_4_ | (uint)!bVar9 * auVar63._20_4_;
      bVar9 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar62._24_4_ = (uint)bVar9 * auVar54._24_4_ | (uint)!bVar9 * auVar63._24_4_;
      bVar9 = SUB81(uVar20 >> 7,0);
      auVar62._28_4_ = (uint)bVar9 * auVar54._28_4_ | (uint)!bVar9 * auVar63._28_4_;
      auVar63 = vmaxps_avx512vl(auVar43,auVar57);
      auVar54._0_4_ = (uint)(bVar8 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar63._0_4_;
      bVar9 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar54._4_4_ = (uint)bVar9 * auVar43._4_4_ | (uint)!bVar9 * auVar63._4_4_;
      bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar54._8_4_ = (uint)bVar9 * auVar43._8_4_ | (uint)!bVar9 * auVar63._8_4_;
      bVar9 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar54._12_4_ = (uint)bVar9 * auVar43._12_4_ | (uint)!bVar9 * auVar63._12_4_;
      bVar9 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar54._16_4_ = (uint)bVar9 * auVar43._16_4_ | (uint)!bVar9 * auVar63._16_4_;
      bVar9 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar54._20_4_ = (uint)bVar9 * auVar43._20_4_ | (uint)!bVar9 * auVar63._20_4_;
      bVar9 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar54._24_4_ = (uint)bVar9 * auVar43._24_4_ | (uint)!bVar9 * auVar63._24_4_;
      bVar9 = SUB81(uVar20 >> 7,0);
      auVar54._28_4_ = (uint)bVar9 * auVar43._28_4_ | (uint)!bVar9 * auVar63._28_4_;
      auVar43 = vmaxps_avx512vl(auVar64,auVar58);
      auVar63._0_4_ = (uint)(bVar8 & 1) * auVar64._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar43._0_4_;
      bVar9 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar63._4_4_ = (uint)bVar9 * auVar64._4_4_ | (uint)!bVar9 * auVar43._4_4_;
      bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar63._8_4_ = (uint)bVar9 * auVar64._8_4_ | (uint)!bVar9 * auVar43._8_4_;
      bVar9 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar63._12_4_ = (uint)bVar9 * auVar64._12_4_ | (uint)!bVar9 * auVar43._12_4_;
      bVar9 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar63._16_4_ = (uint)bVar9 * auVar64._16_4_ | (uint)!bVar9 * auVar43._16_4_;
      bVar9 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar63._20_4_ = (uint)bVar9 * auVar64._20_4_ | (uint)!bVar9 * auVar43._20_4_;
      bVar9 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar63._24_4_ = (uint)bVar9 * auVar64._24_4_ | (uint)!bVar9 * auVar43._24_4_;
      bVar9 = SUB81(uVar20 >> 7,0);
      auVar63._28_4_ = (uint)bVar9 * auVar64._28_4_ | (uint)!bVar9 * auVar43._28_4_;
      auVar43 = vmaxps_avx512vl(auVar41,auVar59);
      auVar64._0_4_ = (uint)(bVar8 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar43._0_4_;
      bVar9 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar64._4_4_ = (uint)bVar9 * auVar41._4_4_ | (uint)!bVar9 * auVar43._4_4_;
      bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar64._8_4_ = (uint)bVar9 * auVar41._8_4_ | (uint)!bVar9 * auVar43._8_4_;
      bVar9 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar64._12_4_ = (uint)bVar9 * auVar41._12_4_ | (uint)!bVar9 * auVar43._12_4_;
      bVar9 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar64._16_4_ = (uint)bVar9 * auVar41._16_4_ | (uint)!bVar9 * auVar43._16_4_;
      bVar9 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar64._20_4_ = (uint)bVar9 * auVar41._20_4_ | (uint)!bVar9 * auVar43._20_4_;
      bVar9 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar64._24_4_ = (uint)bVar9 * auVar41._24_4_ | (uint)!bVar9 * auVar43._24_4_;
      bVar9 = SUB81(uVar20 >> 7,0);
      auVar64._28_4_ = (uint)bVar9 * auVar41._28_4_ | (uint)!bVar9 * auVar43._28_4_;
      vandps_avx512vl(auVar56,auVar55);
      auVar41 = vmaxps_avx(auVar68,auVar64);
      bVar9 = (bool)((byte)(uVar20 >> 1) & 1);
      bVar10 = (bool)((byte)(uVar20 >> 2) & 1);
      bVar11 = (bool)((byte)(uVar20 >> 3) & 1);
      bVar12 = (bool)((byte)(uVar20 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar20 >> 5) & 1);
      bVar14 = (bool)((byte)(uVar20 >> 6) & 1);
      bVar15 = SUB81(uVar20 >> 7,0);
      auVar69 = ZEXT3264(CONCAT428((uint)bVar15 * auVar69._28_4_ | (uint)!bVar15 * auVar41._28_4_,
                                   CONCAT424((uint)bVar14 * auVar69._24_4_ |
                                             (uint)!bVar14 * auVar41._24_4_,
                                             CONCAT420((uint)bVar13 * auVar69._20_4_ |
                                                       (uint)!bVar13 * auVar41._20_4_,
                                                       CONCAT416((uint)bVar12 * auVar69._16_4_ |
                                                                 (uint)!bVar12 * auVar41._16_4_,
                                                                 CONCAT412((uint)bVar11 *
                                                                           auVar69._12_4_ |
                                                                           (uint)!bVar11 *
                                                                           auVar41._12_4_,
                                                                           CONCAT48((uint)bVar10 *
                                                                                    auVar69._8_4_ |
                                                                                    (uint)!bVar10 *
                                                                                    auVar41._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar9 * auVar69._4_4_ |
                                                  (uint)!bVar9 * auVar41._4_4_,
                                                  (uint)(bVar8 & 1) * auVar69._0_4_ |
                                                  (uint)!(bool)(bVar8 & 1) * auVar41._0_4_))))))));
      auVar41 = auVar64;
      auVar43 = auVar54;
      auVar64 = auVar63;
      auVar54 = auVar62;
      auVar62 = auVar61;
      auVar63 = auVar60;
    }
    auVar40 = vshufps_avx512vl(auVar62,auVar62,0xb1);
    auVar40 = vminps_avx512vl(auVar62,auVar40);
    auVar62 = vshufpd_avx(auVar40,auVar40,5);
    auVar62 = vminps_avx(auVar40,auVar62);
    auVar34 = vminps_avx(auVar62._0_16_,auVar62._16_16_);
    auVar62 = vshufps_avx512vl(auVar63,auVar63,0xb1);
    auVar62 = vminps_avx512vl(auVar63,auVar62);
    auVar63 = vshufpd_avx(auVar62,auVar62,5);
    auVar63 = vminps_avx(auVar62,auVar63);
    auVar66 = vminps_avx(auVar63._0_16_,auVar63._16_16_);
    auVar66 = vunpcklps_avx(auVar34,auVar66);
    auVar63 = vshufps_avx512vl(auVar54,auVar54,0xb1);
    auVar54 = vminps_avx512vl(auVar54,auVar63);
    auVar63 = vshufpd_avx(auVar54,auVar54,5);
    auVar63 = vminps_avx(auVar54,auVar63);
    auVar34 = vminps_avx(auVar63._0_16_,auVar63._16_16_);
    auVar34 = vinsertps_avx(auVar66,auVar34,0x28);
    auVar63 = vshufps_avx(auVar43,auVar43,0xb1);
    auVar43 = vmaxps_avx(auVar43,auVar63);
    auVar63 = vshufpd_avx(auVar43,auVar43,5);
    auVar43 = vmaxps_avx(auVar43,auVar63);
    auVar66 = vmaxps_avx(auVar43._0_16_,auVar43._16_16_);
    auVar43 = vshufps_avx(auVar64,auVar64,0xb1);
    auVar43 = vmaxps_avx(auVar64,auVar43);
    auVar64 = vshufpd_avx(auVar43,auVar43,5);
    auVar43 = vmaxps_avx(auVar43,auVar64);
    auVar37 = vmaxps_avx(auVar43._0_16_,auVar43._16_16_);
    auVar37 = vunpcklps_avx(auVar66,auVar37);
    auVar43 = vshufps_avx(auVar41,auVar41,0xb1);
    auVar41 = vmaxps_avx(auVar41,auVar43);
    auVar43 = vshufpd_avx(auVar41,auVar41,5);
    auVar41 = vmaxps_avx(auVar41,auVar43);
    auVar66 = vmaxps_avx(auVar41._0_16_,auVar41._16_16_);
    auVar66 = vinsertps_avx(auVar37,auVar66,0x28);
    auVar41 = vshufps_avx(auVar68,auVar68,0xb1);
    auVar41 = vmaxps_avx(auVar68,auVar41);
    auVar43 = vshufpd_avx(auVar41,auVar41,5);
    auVar41 = vmaxps_avx(auVar41,auVar43);
    auVar37 = vmaxps_avx(auVar41._0_16_,auVar41._16_16_);
    fVar65 = auVar37._0_4_;
    auVar76._4_4_ = fVar65;
    auVar76._0_4_ = fVar65;
    auVar76._8_4_ = fVar65;
    auVar76._12_4_ = fVar65;
    auVar34 = vsubps_avx(auVar34,auVar76);
    auVar70._0_4_ = auVar66._0_4_ + fVar65;
    auVar70._4_4_ = auVar66._4_4_ + fVar65;
    auVar70._8_4_ = auVar66._8_4_ + fVar65;
    auVar70._12_4_ = auVar66._12_4_ + fVar65;
  }
  auVar71._8_4_ = 0x7fffffff;
  auVar71._0_8_ = 0x7fffffff7fffffff;
  auVar71._12_4_ = 0x7fffffff;
  auVar66 = vandps_avx(auVar34,auVar71);
  auVar37 = vandps_avx(auVar70,auVar71);
  auVar66 = vmaxps_avx(auVar66,auVar37);
  auVar37 = vmovshdup_avx(auVar66);
  auVar37 = vmaxss_avx(auVar37,auVar66);
  auVar66 = vshufpd_avx(auVar66,auVar66,1);
  auVar66 = vmaxss_avx(auVar66,auVar37);
  fVar65 = auVar66._0_4_ * 4.7683716e-07;
  auVar72._4_4_ = fVar65;
  auVar72._0_4_ = fVar65;
  auVar72._8_4_ = fVar65;
  auVar72._12_4_ = fVar65;
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar34,auVar72);
  (__return_storage_ptr__->lower).field_0 = aVar1;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar70._0_4_ + fVar65;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar70._4_4_ + fVar65;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar70._8_4_ + fVar65;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar70._12_4_ + fVar65;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }